

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

ref<immutable::rrb<int,_false,_6>_> * __thiscall
immutable::ref<immutable::rrb<int,_false,_6>_>::operator=
          (ref<immutable::rrb<int,_false,_6>_> *this,ref<immutable::rrb<int,_false,_6>_> *r)

{
  rrb<int,_false,_6> *prVar1;
  ref<immutable::rrb<int,_false,_6>_> local_10;
  
  prVar1 = r->ptr;
  if (prVar1 != (rrb<int,_false,_6> *)0x0) {
    prVar1->_ref_count = prVar1->_ref_count + 1;
  }
  local_10 = (ref<immutable::rrb<int,_false,_6>_>)this->ptr;
  this->ptr = prVar1;
  ~ref(&local_10);
  return this;
}

Assistant:

ref<T>& ref<T>::operator = (const ref<T>& r)
      {
      ref<T> temp(r);
      swap(temp);
      return *this;
      }